

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

void free_notify_struct(void *input)

{
  notify_thread_struct *p;
  void *input_local;
  
  **(int **)((long)input + 0x58) = **(int **)((long)input + 0x58) + -1;
  if (**(int **)((long)input + 0x58) == 0) {
    free(*input);
    ixmlFreeDOMString(*(char **)((long)input + 8));
    free(*(void **)((long)input + 0x10));
    free(*(void **)((long)input + 0x18));
    free(*(void **)((long)input + 0x58));
  }
  free(input);
  return;
}

Assistant:

static void free_notify_struct(
	/*! [in] Notify structure. */
	void *input)
{
	notify_thread_struct *p = input;

	(*p->reference_count)--;
	if (*p->reference_count == 0) {
		free(p->headers);
		ixmlFreeDOMString(p->propertySet);
		free(p->servId);
		free(p->UDN);
		free(p->reference_count);
	}
	free(p);
}